

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O2

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int resshift;
  ushort *puVar8;
  ulong uVar9;
  ulong uVar10;
  UINT32 acc;
  uint local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ES5503Chip *local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)samples;
  __n = local_38 * 4;
  uVar9 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  bVar1 = *(byte *)((long)param + 0x340);
  lVar5 = (long)param + 0x38;
  local_50 = lVar5;
  local_48 = (ES5503Chip *)param;
  do {
    if (((ES5503Chip *)param)->oscsenabled <= uVar9) {
      return;
    }
    bVar4 = *(byte *)(lVar5 + 4 + uVar9 * 0x18);
    if (((bVar4 & 1) == 0) &&
       (puVar8 = (ushort *)(uVar9 * 0x18 + lVar5), *(char *)((long)puVar8 + 0x15) == '\0')) {
      uVar10 = (ulong)((uint)(byte)puVar8[6] * 4);
      local_54 = *(uint *)((long)wavemasks + uVar10) & *(uint *)(puVar8 + 4);
      acc = *(UINT32 *)(puVar8 + 8);
      local_58 = (uint)*puVar8;
      local_64 = (uint)*(byte *)((long)puVar8 + 5);
      resshift = resshifts[*(byte *)((long)puVar8 + 0xd)] - (uint)(byte)puVar8[6];
      local_5c = *(uint *)((long)accmasks + uVar10);
      bVar2 = ((ES5503Chip *)param)->outchn_mask & bVar4 >> 4;
      local_68 = puVar8[1] - 1 & 0xffff;
      uVar10 = 0;
      local_60 = resshift;
      local_40 = uVar9;
      do {
        if (uVar10 == local_38) break;
        uVar7 = acc >> ((byte)resshift & 0x1f);
        acc = acc + local_58;
        ((ES5503Chip *)param)->channel_strobe = bVar4 >> 4;
        bVar4 = ((ES5503Chip *)param)->docram[(uVar7 & local_5c) + local_54];
        *(byte *)(puVar8 + 3) = bVar4;
        iVar3 = 1;
        if (bVar4 == 0) {
LAB_001623bc:
          es5503_halt_osc((ES5503Chip *)param,(int)uVar9,iVar3,&acc,resshift);
          param = local_48;
          uVar9 = local_40;
          resshift = local_60;
        }
        else {
          iVar3 = (bVar4 - 0x80) * local_64;
          for (bVar4 = 0; (bVar1 & 0xfe) != bVar4; bVar4 = bVar4 + 1) {
            if (bVar2 == bVar4) {
              outputs[bVar2 & 1][uVar10] = outputs[bVar2 & 1][uVar10] + iVar3;
            }
          }
          iVar3 = iVar3 * 0xb5 >> 8;
          bVar4 = ((ES5503Chip *)param)->output_channels;
          for (bVar6 = bVar1 & 0xfe; bVar6 < bVar4; bVar6 = bVar6 + 1) {
            if (bVar2 == bVar6) {
              (*outputs)[uVar10] = (*outputs)[uVar10] + iVar3;
              outputs[1][uVar10] = outputs[1][uVar10] + iVar3;
            }
          }
          iVar3 = 0;
          if (local_68 <= uVar7) goto LAB_001623bc;
        }
        bVar4 = (byte)puVar8[2];
        uVar10 = uVar10 + 1;
      } while ((bVar4 & 1) == 0);
      *(UINT32 *)(puVar8 + 8) = acc;
      lVar5 = local_50;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	chnsStereo = chip->output_channels & ~1;
	for (osc = 0; osc < chip->oscsenabled; osc++)
	{
		ES5503Osc *pOsc = &chip->oscillators[osc];

		if (!(pOsc->control & 1) && ! pOsc->Muted)
		{
			UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
			UINT32 altram;
			UINT32 acc = pOsc->accumulator;
			UINT16 wtsize = pOsc->wtsize - 1;
			UINT16 freq = pOsc->freq;
			INT16 vol = pOsc->vol;
			UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
			int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
			UINT32 sizemask = accmasks[pOsc->wavetblsize];
			INT32 outData;

			chnMask &= chip->outchn_mask;
			for (snum = 0; snum < samples; snum++)
			{
				altram = acc >> resshift;
				ramptr = altram & sizemask;

				acc += freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &acc, resshift);
				}
				else
				{
					outData = (pOsc->data - 0x80) * vol;
					
					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &acc, resshift);
					}
				}

				// if oscillator halted, we've got no more samples to generate
				if (pOsc->control & 1)
				{
					pOsc->control |= 1;
					break;
				}
			}

			pOsc->accumulator = acc;
		}
	}
}